

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O0

token * parse_type(dmr_C *C,token *token,expression **tree)

{
  expression *peVar1;
  symbol *local_28;
  symbol *sym;
  expression **tree_local;
  token *token_local;
  dmr_C *C_local;
  
  sym = (symbol *)tree;
  tree_local = (expression **)token;
  token_local = (token *)C;
  peVar1 = dmrC_alloc_expression(C,token->pos,4);
  *(expression **)sym = peVar1;
  **(ushort **)sym = **(ushort **)sym & 0xff | 0x100;
  tree_local = (expression **)
               dmrC_typename((dmr_C *)token_local,(token *)tree_local,&local_28,(int *)0x0);
  if (local_28->ident != (ident *)0x0) {
    dmrC_sparse_error((dmr_C *)token_local,((token *)tree_local)->pos,
                      "type expression should not include identifier \"%s\"",
                      &local_28->ident->field_0x12);
  }
  *(symbol **)(*(long *)sym + 0x20) = local_28;
  return (token *)tree_local;
}

Assistant:

static struct token *parse_type(struct dmr_C *C, struct token *token, struct expression **tree)
{
	struct symbol *sym;
	*tree = dmrC_alloc_expression(C, token->pos, EXPR_TYPE);
	(*tree)->flags = Int_const_expr; /* sic */
	token = dmrC_typename(C, token, &sym, NULL);
	if (sym->ident)
		dmrC_sparse_error(C, token->pos,
			     "type expression should not include identifier "
			     "\"%s\"", sym->ident->name);
	(*tree)->symbol = sym;
	return token;
}